

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flecs.hpp
# Opt level: O0

void flecs::_::register_lifecycle_actions<Position_const>
               (ecs_world_t *world,ecs_entity_t component,bool ctor,bool dtor,bool copy,bool move)

{
  _Bool _Var1;
  undefined1 local_48 [8];
  EcsComponentLifecycle cl;
  bool move_local;
  bool copy_local;
  bool dtor_local;
  bool ctor_local;
  ecs_entity_t component_local;
  ecs_world_t *world_local;
  
  cl.ctx._4_1_ = move;
  cl.ctx._5_1_ = copy;
  cl.ctx._6_1_ = dtor;
  cl.ctx._7_1_ = ctor;
  _Var1 = ecs_component_has_actions(world,component);
  if (!_Var1) {
    memset(local_48,0,0x28);
    if ((cl.ctx._7_1_ & 1) != 0) {
      local_48 = (undefined1  [8])component_ctor<Position>;
    }
    if ((cl.ctx._6_1_ & 1) != 0) {
      cl.ctor = component_dtor<Position>;
    }
    if ((cl.ctx._5_1_ & 1) != 0) {
      cl.dtor = component_copy<Position>;
    }
    if ((cl.ctx._4_1_ & 1) != 0) {
      cl.copy = component_move<Position>;
    }
    ecs_set_component_actions_w_entity(world,component,(EcsComponentLifecycle *)local_48);
  }
  return;
}

Assistant:

void register_lifecycle_actions(
    ecs_world_t *world,
    ecs_entity_t component,
    bool ctor,
    bool dtor,
    bool copy,
    bool move)
{
    if (!ecs_component_has_actions(world, component)) {
        EcsComponentLifecycle cl{};
        if (ctor) {
            cl.ctor = _::component_ctor<
                typename std::remove_const<
                    typename std::remove_pointer<T>::type>::type>;
        }
        if (dtor) {
            cl.dtor = _::component_dtor<
                typename std::remove_const<
                    typename std::remove_pointer<T>::type>::type>;
        }
        if (copy) {
            cl.copy = _::component_copy<
                typename std::remove_const<
                    typename std::remove_pointer<T>::type>::type>;
        }
        if (move) {
            cl.move = _::component_move<
                typename std::remove_const<
                    typename std::remove_pointer<T>::type>::type>;
        }

        ecs_set_component_actions_w_entity( world, component, &cl);
    }
}